

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<capnp::JsonCodec::AnnotatedHandler> __thiscall
kj::
heap<capnp::JsonCodec::AnnotatedHandler,capnp::JsonCodec&,capnp::StructSchema&,kj::Maybe<capnp::json::DiscriminatorOptions::Reader>&,kj::Maybe<kj::StringPtr>&,kj::Vector<capnp::Schema>&>
          (kj *this,JsonCodec *params,StructSchema *params_1,
          Maybe<capnp::json::DiscriminatorOptions::Reader> *params_2,Maybe<kj::StringPtr> *params_3,
          Vector<capnp::Schema> *params_4)

{
  AnnotatedHandler *this_00;
  JsonCodec *codec;
  StructSchema *pSVar1;
  Maybe<capnp::json::DiscriminatorOptions::Reader> *other;
  Maybe<kj::StringPtr> *other_00;
  Vector<capnp::Schema> *dependencies;
  AnnotatedHandler *extraout_RDX;
  Own<capnp::JsonCodec::AnnotatedHandler> OVar2;
  Maybe<kj::StringPtr> local_a0;
  Maybe<capnp::json::DiscriminatorOptions::Reader> local_78;
  StructSchema local_40;
  Vector<capnp::Schema> *local_38;
  Vector<capnp::Schema> *params_local_4;
  Maybe<kj::StringPtr> *params_local_3;
  Maybe<capnp::json::DiscriminatorOptions::Reader> *params_local_2;
  StructSchema *params_local_1;
  JsonCodec *params_local;
  
  local_38 = params_4;
  params_local_4 = (Vector<capnp::Schema> *)params_3;
  params_local_3 = (Maybe<kj::StringPtr> *)params_2;
  params_local_2 = (Maybe<capnp::json::DiscriminatorOptions::Reader> *)params_1;
  params_local_1 = (StructSchema *)params;
  params_local = (JsonCodec *)this;
  this_00 = (AnnotatedHandler *)operator_new(0xd8);
  codec = fwd<capnp::JsonCodec&>((JsonCodec *)params_local_1);
  pSVar1 = fwd<capnp::StructSchema&>((StructSchema *)params_local_2);
  local_40.super_Schema.raw = (Schema)(pSVar1->super_Schema).raw;
  other = fwd<kj::Maybe<capnp::json::DiscriminatorOptions::Reader>&>
                    ((Maybe<capnp::json::DiscriminatorOptions::Reader> *)params_local_3);
  Maybe<capnp::json::DiscriminatorOptions::Reader>::Maybe(&local_78,other);
  other_00 = fwd<kj::Maybe<kj::StringPtr>&>((Maybe<kj::StringPtr> *)params_local_4);
  Maybe<kj::StringPtr>::Maybe(&local_a0,other_00);
  dependencies = fwd<kj::Vector<capnp::Schema>&>(local_38);
  capnp::JsonCodec::AnnotatedHandler::AnnotatedHandler
            (this_00,codec,local_40,&local_78,&local_a0,dependencies);
  Own<capnp::JsonCodec::AnnotatedHandler>::Own
            ((Own<capnp::JsonCodec::AnnotatedHandler> *)this,this_00,
             (Disposer *)&_::HeapDisposer<capnp::JsonCodec::AnnotatedHandler>::instance);
  Maybe<kj::StringPtr>::~Maybe(&local_a0);
  Maybe<capnp::json::DiscriminatorOptions::Reader>::~Maybe(&local_78);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}